

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInSignature(Psbt *this,uint32_t index,KeyData *key,ByteData *signature)

{
  void *pvVar1;
  CfdException *this_00;
  undefined4 in_register_00000034;
  allocator local_85;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  undefined1 local_68 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x953,"SetTxInSignature");
  pvVar1 = this->wally_psbt_pointer_;
  KeyData::GetPubkey((Pubkey *)&sig,key);
  Pubkey::GetData((ByteData *)local_68,(Pubkey *)&sig);
  ByteData::GetBytes(&pubkey,(ByteData *)local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ByteData::GetBytes(&sig,signature);
  ret = wally_psbt_input_add_signature
                  ((ulong)index * 0x110 + *(long *)((long)pvVar1 + 0x10),
                   pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_68._0_8_ = "cfdcore_psbt.cpp";
  local_68._8_4_ = 0x95d;
  local_68._16_8_ = "SetTxInSignature";
  logger::warn<int&>((CfdSourceLocation *)local_68,"wally_psbt_input_add_signature NG[{}]",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_68,"psbt add input sig error.",&local_85);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInSignature(
    uint32_t index, const KeyData &key, const ByteData &signature) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto pubkey = key.GetPubkey().GetData().GetBytes();
  auto sig = signature.GetBytes();

  int ret = wally_psbt_input_add_signature(
      &psbt_pointer->inputs[index], pubkey.data(), pubkey.size(), sig.data(),
      sig.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_add_signature NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add input sig error.");
  }
}